

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cqm.cpp
# Opt level: O0

uint32_t crc32(uint8_t *buf,int len,uint32_t crc)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  anon_class_1_0_00000001 local_2d [20];
  allocator<unsigned_int> local_19;
  uint32_t local_18;
  int local_14;
  uint32_t crc_local;
  int len_local;
  uint8_t *buf_local;
  
  local_18 = crc;
  local_14 = len;
  _crc_local = buf;
  if (crc32(unsigned_char_const*,int,unsigned_int)::crc_table == '\0') {
    iVar2 = __cxa_guard_acquire(&crc32(unsigned_char_const*,int,unsigned_int)::crc_table);
    if (iVar2 != 0) {
      std::allocator<unsigned_int>::allocator(&local_19);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&crc32::crc_table,0x40,&local_19);
      std::allocator<unsigned_int>::~allocator(&local_19);
      __cxa_atexit(std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector,
                   &crc32::crc_table,&__dso_handle);
      __cxa_guard_release(&crc32(unsigned_char_const*,int,unsigned_int)::crc_table);
    }
  }
  std::call_once<crc32(unsigned_char_const*,int,unsigned_int)::__0>(&crc32::flag,local_2d);
  while (0 < local_14) {
    bVar1 = *_crc_local;
    local_14 = local_14 + -1;
    _crc_local = _crc_local + 1;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&crc32::crc_table,(ulong)((local_18 ^ bVar1) & 0x3f));
    local_18 = *pvVar3 ^ local_18 >> 8;
  }
  return local_18;
}

Assistant:

static uint32_t crc32(const uint8_t* buf, int len, uint32_t crc = 0)
{
    static std::vector<uint32_t> crc_table(0x40);   // 6-bit
    static std::once_flag flag;

    std::call_once(flag, [] {
        for (uint32_t i = 0; i < static_cast<uint32_t>(crc_table.size()); ++i)
        {
            auto entry = i;
            for (int j = 0; j < 8; ++j)
                entry = (entry >> 1) ^ ((entry & 1) ? 0xEDB88320 : 0);
            crc_table[i] = entry;
        }
        });

    while (len-- > 0)
        crc = crc_table[(crc ^ *buf++) & 0x3f] ^ (crc >> 8);

    return crc;
}